

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::createMethodHandle<std::__cxx11::string,category_const&,0ul>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&)>
  local_48;
  undefined1 local_21;
  jsonrpccxx *local_20;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&)>
  *method_local;
  MethodHandle *local_10;
  MethodHandle *handle;
  
  local_21 = 0;
  local_20 = this;
  local_10 = __return_storage_ptr__;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&)>
  ::function(&local_48,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&)>
              *)this);
  std::
  function<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)>
  ::
  function<jsonrpccxx::createMethodHandle<std::__cxx11::string,category_const&,0ul>(std::function<std::__cxx11::string(category_const&)>,std::integer_sequence<unsigned_long,0ul>)::_lambda(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)_1_,void>
            ((function<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)>
              *)__return_storage_ptr__,(anon_class_32_1_60e9c21f *)&local_48);
  createMethodHandle<std::__cxx11::string,category_const&,0ul>(std::function<std::__cxx11::string(category_const&)>,std::integer_sequence<unsigned_long,0ul>)
  ::
  {lambda(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)#1}
  ::~integer_sequence((_lambda_nlohmann__basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const___1_
                       *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle createMethodHandle(std::function<ReturnType(ParamTypes...)> method, std::index_sequence<index...>) {
    MethodHandle handle = [method](const json &params) -> json {
      size_t actualSize = params.size();
      size_t formalSize = sizeof...(ParamTypes);
      // TODO: add lenient mode for backwards compatible additional params
      if (actualSize != formalSize) {
        throw JsonRpcException(invalid_params, "invalid parameter: expected " + std::to_string(formalSize) + " argument(s), but found " + std::to_string(actualSize));
      }
      (check_param_type<typename std::decay<ParamTypes>::type>(index, params[index], GetType(type<typename std::decay<ParamTypes>::type>())), ...);
      return method(params[index].get<typename std::decay<ParamTypes>::type>()...);
    };
    return handle;
  }